

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O0

void __thiscall Vector<Fad<double>_>::destroy(Vector<Fad<double>_> *this)

{
  long lVar1;
  long lVar2;
  Fad<double> *this_00;
  long lVar3;
  undefined4 *in_RDI;
  
  if ((*(long *)(in_RDI + 2) != 0) && (lVar1 = *(long *)(in_RDI + 2), lVar1 != 0)) {
    this_00 = (Fad<double> *)(lVar1 + -8);
    lVar2 = *(long *)(lVar1 + -8);
    for (lVar3 = lVar1 + lVar2 * 0x20; lVar1 != lVar3; lVar3 = lVar3 + -0x20) {
      Fad<double>::~Fad(this_00);
    }
    operator_delete__(this_00,lVar2 * 0x20 + 8);
  }
  *in_RDI = 0;
  *(undefined8 *)(in_RDI + 2) = 0;
  return;
}

Assistant:

inline void Vector< T >::destroy() 
{
#ifdef DEBUG
    fprintf(stderr,"Vector<>::destroy()         |                   | adr =  %x \n", ptr_to_data);
#endif
    if (ptr_to_data != 0) 
	delete [] ptr_to_data; 
    else {
    }	

    num_elts = 0; ptr_to_data = (T*)0;
}